

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall
QWidgetWindow::handleDragEnterEvent(QWidgetWindow *this,QDragMoveEvent *event,QWidget *widget)

{
  bool bVar1;
  DropActions DVar2;
  MouseButtons MVar3;
  KeyboardModifiers KVar4;
  QMimeData *pQVar5;
  QWidget *pQVar6;
  QWidget *in_RDX;
  QDropEvent *in_RSI;
  long in_FS_OFFSET;
  QDragEnterEvent translated;
  QPoint mapped;
  QWidget *in_stack_ffffffffffffff08;
  QPointer<QWidget> *in_stack_ffffffffffffff10;
  QPoint *in_stack_ffffffffffffff18;
  QWidget *in_stack_ffffffffffffff20;
  QDropEvent *pQVar7;
  QWidget *local_b0;
  QDragEnterEvent local_98 [80];
  QPointF local_48;
  QPoint local_38;
  QPoint local_30;
  QPoint local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = in_RDX;
  if (in_RDX == (QWidget *)0x0) {
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b5e2b);
    local_20 = QDropEvent::position((QDropEvent *)in_stack_ffffffffffffff18);
    local_10 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff20);
    local_b0 = findDnDTarget(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (local_b0 == (QWidget *)0x0) {
    QDragMoveEvent::ignore((QDragMoveEvent *)0x3b5e8a);
  }
  else {
    QPointer<QWidget>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_28 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b5ec9);
    local_48 = QDropEvent::position((QDropEvent *)in_stack_ffffffffffffff18);
    local_38 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff20);
    local_30 = QWidget::mapToGlobal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_28 = QWidget::mapFromGlobal(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    memcpy(local_98,&DAT_00aa4b48,0x50);
    DVar2 = QDropEvent::possibleActions((QDropEvent *)local_b0);
    pQVar5 = QDropEvent::mimeData(in_RSI);
    MVar3 = QDropEvent::buttons((QDropEvent *)local_b0);
    KVar4 = QDropEvent::modifiers((QDropEvent *)local_b0);
    QDragEnterEvent::QDragEnterEvent
              (local_98,(QPoint *)&local_28,
               (QFlags_conflict1 *)
               (ulong)(uint)DVar2.super_QFlagsStorageHelper<Qt::DropAction,_4>.
                            super_QFlagsStorage<Qt::DropAction>.i,pQVar5,
               (QFlags_conflict1 *)
               (ulong)(uint)MVar3.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                            super_QFlagsStorage<Qt::MouseButton>.i,
               (QFlags_conflict1 *)
               (ulong)(uint)KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i);
    pQVar6 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b5fb3);
    QCoreApplication::forwardEvent(&pQVar6->super_QObject,(QEvent *)local_98,(QEvent *)in_RSI);
    pQVar7 = in_RSI;
    bVar1 = QEvent::isAccepted((QEvent *)local_98);
    (**(code **)(*(long *)pQVar7 + 0x10))(pQVar7,bVar1);
    QDropEvent::dropAction((QDropEvent *)local_98);
    QDropEvent::setDropAction((DropAction)in_RSI);
    QDragEnterEvent::~QDragEnterEvent(local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleDragEnterEvent(QDragMoveEvent *event, QWidget *widget)
{
    Q_ASSERT(m_dragTarget == nullptr);
    if (!widget)
        widget = findDnDTarget(m_widget, event->position().toPoint());
    if (!widget) {
        event->ignore();
        return;
    }
    m_dragTarget = widget;

    const QPoint mapped = widget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDragEnterEvent translated(mapped, event->possibleActions(), event->mimeData(),
                               event->buttons(), event->modifiers());
    QGuiApplication::forwardEvent(m_dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}